

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

GaoVectorSet * __thiscall
AlphaVectorPlanning::BackProjectFull
          (GaoVectorSet *__return_storage_ptr__,AlphaVectorPlanning *this,VectorSet *v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  size_type sVar5;
  pointer pvVar6;
  size_type sVar7;
  long lVar8;
  uint uVar9;
  size_t sVar10;
  PlanningUnitDecPOMDPDiscrete *pPVar11;
  long lVar12;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar13;
  double *pdVar14;
  E *this_00;
  ulong uVar15;
  pointer pcVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  size_type sVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  VectorSet v1;
  vector<int,_std::allocator<int>_> duplicates;
  ulong local_140;
  int local_130;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_118;
  double *local_108;
  ulong local_100;
  size_type local_f8;
  ulong local_f0;
  double *local_e8;
  ulong local_e0;
  long local_d8;
  GaoVectorSet *local_d0;
  undefined1 local_c8 [16];
  new_allocator<double> local_b8 [8];
  size_type local_b0;
  double *local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  pointer local_88;
  long local_80;
  pointer local_78;
  pointer local_70;
  vector<int,_std::allocator<int>_> local_68;
  string local_50;
  
  pPVar11 = this->_m_pu;
  if (pPVar11 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar11 = (this->_m_puShared).px;
  }
  uVar9 = (**(code **)((long)*(pPVar11->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar11 = this->_m_pu;
  if (pPVar11 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar11 = (this->_m_puShared).px;
  }
  local_100 = (**(code **)((long)*(pPVar11->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  pPVar11 = this->_m_pu;
  if (pPVar11 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar11 = (this->_m_puShared).px;
  }
  sVar10 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar11->super_PlanningUnitMADPDiscrete);
  local_f8 = v->size1_;
  pPVar11 = this->_m_pu;
  if (pPVar11 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar11 = (this->_m_puShared).px;
  }
  if ((int)local_f8 == 0) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,
         "AlphaVectorPlanning::BackProjectFull attempting to backproject empty value function");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  bVar3 = (pPVar11->super_PlanningUnitMADPDiscrete)._m_params._m_eventObservability;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"BackProjectFull","");
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,(string *)local_128);
  pcVar16 = (pointer)(local_f8 & 0xffffffff);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,aStack_118._M_allocated_capacity + 1);
  }
  local_128._8_8_ = ZEXT48(uVar9);
  aStack_118._8_8_ = local_100 & 0xffffffff;
  local_128._0_8_ = (pointer)0x0;
  aStack_118._M_allocated_capacity = 0;
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(__return_storage_ptr__,(extent_gen<2UL> *)local_128);
  local_128._8_8_ = sVar10 & 0xffffffff;
  aStack_118._8_8_ = (long)pcVar16 * local_128._8_8_;
  local_128._0_8_ = pcVar16;
  if (aStack_118._8_8_ == 0) {
    local_108 = (double *)0x0;
  }
  else {
    local_108 = __gnu_cxx::new_allocator<double>::allocate
                          ((new_allocator<double> *)(local_128 + 0x10),aStack_118._8_8_,(void *)0x0)
    ;
  }
  local_c8._0_8_ = v->size1_;
  local_c8._8_8_ = v->size2_;
  local_b0 = (v->data_).size_;
  if (local_b0 == 0) {
    local_a8 = (double *)0x0;
  }
  else {
    local_a8 = __gnu_cxx::new_allocator<double>::allocate(local_b8,local_b0,(void *)0x0);
    sVar5 = (v->data_).size_;
    if (sVar5 != 0) {
      memmove(local_a8,(v->data_).data_,sVar5 << 3);
    }
  }
  GetDuplicateIndices(&local_68,v);
  local_d0 = __return_storage_ptr__;
  if (uVar9 != 0) {
    local_98 = local_100 & 0xffffffff;
    local_a0 = (ulong)uVar9;
    local_140 = 0;
    do {
      if ((int)local_100 != 0) {
        local_90 = local_140 * 0x18;
        local_d8 = 0;
        local_f0 = 0;
        do {
          local_78 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_88 = (this->_m_T).
                     super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_e0 = local_128._8_8_;
          local_80 = local_128._8_8_ * 8;
          lVar17 = 0;
          local_e8 = local_108;
          lVar18 = 0;
          pdVar14 = local_108;
          do {
            iVar4 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar18];
            local_130 = (int)sVar10;
            if ((long)iVar4 == -1) {
              if (local_130 != 0) {
                pmVar13 = local_88[local_140];
                local_70 = (this->_m_O).
                           super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pvVar6 = (this->_m_Oe).
                         super__Vector_base<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar12 = 0;
                uVar15 = 0;
                do {
                  if (bVar3 == false) {
                    sVar7 = pmVar13->size2_;
                    if (sVar7 == 0) goto LAB_003a2179;
                    pdVar19 = (double *)((long)(local_70[local_140]->data_).data_ + local_d8);
                    auVar22 = ZEXT816(0);
                    sVar20 = 0;
                    do {
                      auVar2._8_8_ = 0;
                      auVar2._0_8_ = *(ulong *)((long)local_a8 +
                                               sVar20 * 8 + local_c8._8_8_ * lVar17);
                      auVar24._8_8_ = 0;
                      auVar24._0_8_ =
                           *(double *)((long)(pmVar13->data_).data_ + sVar20 * 8 + sVar7 * lVar12) *
                           *pdVar19;
                      auVar22 = vfmadd231sd_fma(auVar22,auVar24,auVar2);
                      dVar21 = auVar22._0_8_;
                      sVar20 = sVar20 + 1;
                      pdVar19 = pdVar19 + local_70[local_140]->size2_;
                    } while (sVar7 != sVar20);
                  }
                  else {
                    sVar7 = pmVar13->size2_;
                    if (sVar7 == 0) {
LAB_003a2179:
                      dVar21 = 0.0;
                    }
                    else {
                      lVar8 = *(long *)(*(long *)((long)&(pvVar6->
                                                  super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                                                  )._M_impl.super__Vector_impl_data + local_90) +
                                       local_f0 * 8);
                      auVar22 = ZEXT816(0);
                      sVar20 = 0;
                      do {
                        auVar1._8_8_ = 0;
                        auVar1._0_8_ = *(ulong *)((long)local_a8 +
                                                 sVar20 * 8 + local_c8._8_8_ * lVar17);
                        auVar23._8_8_ = 0;
                        auVar23._0_8_ =
                             *(double *)((long)(pmVar13->data_).data_ + sVar20 * 8 + sVar7 * lVar12)
                             * *(double *)
                                (*(long *)(lVar8 + 8) * lVar12 + *(long *)(lVar8 + 0x20) +
                                sVar20 * 8);
                        auVar22 = vfmadd231sd_fma(auVar22,auVar23,auVar1);
                        dVar21 = auVar22._0_8_;
                        sVar20 = sVar20 + 1;
                      } while (sVar7 != sVar20);
                    }
                  }
                  local_108[local_128._8_8_ * lVar18 + uVar15] = dVar21;
                  uVar15 = uVar15 + 1;
                  lVar12 = lVar12 + 8;
                  __return_storage_ptr__ = local_d0;
                } while (uVar15 != (sVar10 & 0xffffffff));
              }
            }
            else if (local_130 != 0) {
              uVar15 = 0;
              do {
                pdVar14[uVar15] = local_108[(long)iVar4 * local_128._8_8_ + uVar15];
                uVar15 = uVar15 + 1;
              } while ((sVar10 & 0xffffffff) != uVar15);
            }
            lVar18 = lVar18 + 1;
            pdVar14 = pdVar14 + local_128._8_8_;
            lVar17 = lVar17 + 8;
          } while ((int)lVar18 != (int)local_f8);
          pmVar13 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     *)operator_new(0x28);
          pmVar13->size1_ = local_128._0_8_;
          pmVar13->size2_ = local_128._8_8_;
          *(undefined8 *)(&(pmVar13->data_).field_0x0 + 8) = aStack_118._8_8_;
          if (aStack_118._8_8_ == 0) {
            (pmVar13->data_).data_ = (pointer)0x0;
          }
          else {
            pdVar14 = __gnu_cxx::new_allocator<double>::allocate
                                ((new_allocator<double> *)&pmVar13->data_,aStack_118._8_8_,
                                 (void *)0x0);
            (pmVar13->data_).data_ = pdVar14;
            if (aStack_118._8_8_ != 0) {
              memmove(pdVar14,local_108,aStack_118._8_8_ << 3);
            }
          }
          (__return_storage_ptr__->
          super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
          ).
          super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
          .base_[(__return_storage_ptr__->
                 super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                 ).
                 super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                 .origin_offset_ +
                 (__return_storage_ptr__->
                 super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                 ).
                 super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                 .stride_list_.elems[0] * local_140 +
                 (__return_storage_ptr__->
                 super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                 ).
                 super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                 .stride_list_.elems[1] * local_f0] = pmVar13;
          local_f0 = local_f0 + 1;
          local_d8 = local_d8 + 8;
        } while (local_f0 != local_98);
      }
      local_140 = local_140 + 1;
    } while (local_140 != local_a0);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BackProjectFull","");
  TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0 != 0) {
    operator_delete(local_a8,local_b0 << 3);
  }
  if (aStack_118._8_8_ != 0) {
    operator_delete(local_108,aStack_118._8_8_ << 3);
  }
  return __return_storage_ptr__;
}

Assistant:

GaoVectorSet AlphaVectorPlanning::BackProjectFull(const VectorSet &v) const
{
    unsigned int nrA=GetPU()->GetNrJointActions(),
        nrO=GetPU()->GetNrJointObservations(),
        nrS=GetPU()->GetNrStates(),
        nrInV=v.size1();
    bool isEventDriven = GetPU()->GetParams().GetEventObservability();
    if(nrInV==0)
        throw(E("AlphaVectorPlanning::BackProjectFull attempting to backproject empty value function"));

#if DEBUG_AlphaVectorPlanning_BackProject
    tms timeStruct;
    clock_t ticks_before, ticks_after;
    ticks_before = times(&timeStruct);
#endif

    StartTimer("BackProjectFull");
    
    GaoVectorSet G(boost::extents[nrA][nrO]);
    VectorSet v1(nrInV,nrS);
#if AlphaVectorPlanning_UseUBLASinBackProject
    VectorSet vv=v;
#endif
    double x;

#if AlphaVectorPlanning_CheckForDuplicates
    vector<int> duplicates=GetDuplicateIndices(v);
#else
    vector<int> duplicates(nrInV,-1);
#endif
    int dup;

    using namespace boost::numeric::ublas;

    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
        {
            for(unsigned int k=0;k!=nrInV;k++)
            {
                if(duplicates[k]==-1)
                {
#if AlphaVectorPlanning_UseUBLASinBackProject
                    const matrix_row<VectorSet> mV(vv,k);
#endif
                    for(unsigned int s=0;s!=nrS;s++)
                    {
#if AlphaVectorPlanning_UseUBLASinBackProject
                        matrix_row<const TransitionModelMapping::Matrix>
                            mT(*_m_T[a],s);
                        if(isEventDriven)
                        {
                            /// The distinction between row and column stems from the fact that
                            /// in a standard model, _m_O[a] is (s',o), while in an event-driven
                            /// model, _m_Oe[a][o] is (s,s') (because _m_T[a] is also (s,s'))
                            /// The distinction between row and column stems from the fact that
                            /// in a standard model, _m_O[a] is (s',o), while in an event-driven
                            /// model, _m_Oe[a][o] is (s,s') (because _m_T[a] is also (s,s'))
                            matrix_row<const ObservationModelMapping::Matrix> mO(*_m_Oe[a][o],s);
                            x=inner_prod(element_prod(mT,mO),mV);
                        }else{
                            matrix_column<const ObservationModelMapping::Matrix> mO(*_m_O[a],o);
                            x=inner_prod(element_prod(mT,mO),mV);
                        }
#if AlphaVectorPlanning_VerifyUBLASinBackProject
                        double x1=0;
                        for(unsigned int s1=0;s1!=nrS;s1++)
                            x1+=(*_m_O[a])(s1,o)*(*_m_T[a])(s,s1)*v(k,s1);
                        if(abs(x-x1)>1e-14)
                        {
                            cerr << x << " " << x1 << " " << x-x1 << endl;
                            abort();
                        }
#endif
#else // AlphaVectorPlanning_UseUBLASinBackProject
                        x=0;
                        for(unsigned int s1=0;s1!=nrS;s1++)
                            x+=(*_m_O[a])(s1,o)*(*_m_T[a])(s,s1)*v(k,s1);
#endif
                        v1(k,s)=x;
                    }
                }
                else
                {
                    dup=duplicates[k];
                    for(unsigned int s=0;s!=nrS;s++)
                        v1(k,s)=v1(dup,s);
                }
            }
            G[a][o]=new VectorSet(v1);
        }

    StopTimer("BackProjectFull");

#if DEBUG_AlphaVectorPlanning_BackProjectFullPrintout
    cout << "BackProjectFull of:" << endl;
    for(unsigned int k=0;k!=nrInV;k++)
    {
        for(unsigned int s=0;s!=nrS;s++)
            cout << v(k,s) << " ";
        cout << endl;
    }

    VectorSet *VS;
    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
        {
            cout << "Gao a " << a << " o " << o << endl;

            VS=G[a][o];
            for(unsigned int k=0;k!=VS->size1();k++)
            {
                for(unsigned int s=0;s!=VS->size2();s++)
                    cout << (*VS)(k,s) << " ";
                cout << endl;
            }
        }
#endif

#if DEBUG_AlphaVectorPlanning_BackProjectFullSanityCheck
    double maxInV=-DBL_MAX;
    for(unsigned int k=0;k!=nrInV;k++)
        for(unsigned int s=0;s!=nrS;s++)
            maxInV=max(maxInV,v(k,s));

    double maxInGao=-DBL_MAX;
    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
            for(unsigned int k=0;k!=nrInV;k++)
                for(unsigned int s=0;s!=nrS;s++)
                    maxInGao=max(maxInGao,(*G[a][o])(k,s));

    if(maxInGao>maxInV)
    {
        cout << "Max value in V is " << maxInV << ", max in Gao is "
             << maxInGao << endl;
        abort();
    }
#endif

#if DEBUG_AlphaVectorPlanning_BackProject
    ticks_after = times(&timeStruct);
    cout << "AlphaVectorPlanning::BackProject done in " 
         << ticks_after - ticks_before << " clock ticks, "
         << static_cast<double>((ticks_after - ticks_before))
        / sysconf(_SC_CLK_TCK) 
         << "s" << endl;
    // test results on 22-12-2006
    // using dense Matrix is about 2 faster than calling the Get*Prob()
    // using sparse Matrix is almost 3 times slower then dense Matrix
#endif
    return(G);
}